

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.h
# Opt level: O3

void __thiscall
Js::PropertyDescriptor::PropertyDescriptor(PropertyDescriptor *this,PropertyDescriptor *other)

{
  void *pvVar1;
  Type TVar2;
  Type TVar3;
  Type TVar4;
  Type TVar5;
  Type TVar6;
  Type TVar7;
  Type TVar8;
  
  pvVar1 = (other->Value).ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->Value).ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  pvVar1 = (other->Getter).ptr;
  Memory::Recycler::WBSetBit((char *)&this->Getter);
  (this->Getter).ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->Getter);
  pvVar1 = (other->Setter).ptr;
  Memory::Recycler::WBSetBit((char *)&this->Setter);
  (this->Setter).ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->Setter);
  pvVar1 = (other->originalVar).ptr;
  Memory::Recycler::WBSetBit((char *)&this->originalVar);
  (this->originalVar).ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->originalVar);
  TVar2 = other->enumerableSpecified;
  TVar3 = other->configurableSpecified;
  TVar4 = other->valueSpecified;
  TVar5 = other->getterSpecified;
  TVar6 = other->setterSpecified;
  TVar7 = other->Writable;
  TVar8 = other->Enumerable;
  this->writableSpecified = other->writableSpecified;
  this->enumerableSpecified = TVar2;
  this->configurableSpecified = TVar3;
  this->valueSpecified = TVar4;
  this->getterSpecified = TVar5;
  this->setterSpecified = TVar6;
  this->Writable = TVar7;
  this->Enumerable = TVar8;
  this->Configurable = other->Configurable;
  this->fromProxy = other->fromProxy;
  return;
}

Assistant:

PropertyDescriptor(const PropertyDescriptor& other)
            :Value(other.Value),
            Getter(other.Getter),
            Setter(other.Setter),
            originalVar(other.originalVar),
            writableSpecified(other.writableSpecified),
            enumerableSpecified(other.enumerableSpecified),
            configurableSpecified(other.configurableSpecified),
            valueSpecified(other.valueSpecified),
            getterSpecified(other.getterSpecified),
            setterSpecified(other.setterSpecified),
            Writable(other.Writable),
            Enumerable(other.Enumerable),
            Configurable(other.Configurable),
            fromProxy(other.fromProxy)
        {
        }